

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

int google::protobuf::Fls64(uint64 n)

{
  LogMessage *other;
  uint local_68;
  uint local_64;
  uint32 n32;
  int pos;
  byte local_49;
  LogMessage local_48;
  uint64 local_10;
  uint64 n_local;
  
  local_49 = 0;
  local_10 = n;
  if (n == 0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/int128.cc"
               ,0x3b);
    local_49 = 1;
    other = internal::LogMessage::operator<<(&local_48,"CHECK failed: (0) != (n): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&n32 + 3),other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  local_64 = 0;
  if (0xffffffff < local_10) {
    local_10 = local_10 >> 0x20;
    local_64 = 0x20;
  }
  local_68 = (uint)local_10;
  if (0xffff < local_68) {
    local_68 = local_68 >> 0x10;
    local_64 = local_64 | 0x10;
  }
  if (0xff < local_68) {
    local_68 = local_68 >> 8;
    local_64 = local_64 | 8;
  }
  if (0xf < local_68) {
    local_68 = local_68 >> 4;
    local_64 = local_64 | 4;
  }
  return local_64 + ((uint)(0x3333333322221100 >> ((byte)(local_68 << 2) & 0x3f)) & 3);
}

Assistant:

static inline int Fls64(uint64 n) {
  GOOGLE_DCHECK_NE(0, n);
  int pos = 0;
  STEP(uint64, n, pos, 0x20);
  uint32 n32 = n;
  STEP(uint32, n32, pos, 0x10);
  STEP(uint32, n32, pos, 0x08);
  STEP(uint32, n32, pos, 0x04);
  return pos + ((GOOGLE_ULONGLONG(0x3333333322221100) >> (n32 << 2)) & 0x3);
}